

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
::doApply(IRet *__return_storage_ptr__,
         GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
         *this,EvalContext *ctx,IArgs *iargs)

{
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  IArgs *ctx_00;
  Interval *pIVar1;
  Interval *arg1;
  Void *arg2;
  Void *arg3;
  IRet local_48;
  int local_2c;
  IArgs *pIStack_28;
  int ndx;
  IArgs *iargs_local;
  EvalContext *ctx_local;
  GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
  *this_local;
  IRet *ret;
  
  pIStack_28 = iargs;
  iargs_local = (IArgs *)ctx;
  ctx_local = (EvalContext *)this;
  this_local = (GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
                *)__return_storage_ptr__;
  tcu::Vector<tcu::Interval,_2>::Vector(__return_storage_ptr__);
  for (local_2c = 0; ctx_00 = iargs_local, local_2c < 2; local_2c = local_2c + 1) {
    this_00 = this->m_func;
    pIVar1 = tcu::Vector<tcu::Interval,_2>::operator[](pIStack_28->a,local_2c);
    arg1 = tcu::Vector<tcu::Interval,_2>::operator[](pIStack_28->b,local_2c);
    arg2 = Void::operator[](pIStack_28->c,local_2c);
    arg3 = Void::operator[](pIStack_28->d,local_2c);
    Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ::apply(&local_48,this_00,(EvalContext *)ctx_00,pIVar1,arg1,arg2,arg3);
    pIVar1 = tcu::Vector<tcu::Interval,_2>::operator[](__return_storage_ptr__,local_2c);
    pIVar1->m_hasNaN = local_48.m_hasNaN;
    *(undefined7 *)&pIVar1->field_0x1 = local_48._1_7_;
    pIVar1->m_lo = local_48.m_lo;
    pIVar1->m_hi = local_48.m_hi;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply					(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet ret;

		for (int ndx = 0; ndx < Size; ++ndx)
		{
			ret[ndx] =
				m_func.apply(ctx, iargs.a[ndx], iargs.b[ndx], iargs.c[ndx], iargs.d[ndx]);
		}

		return ret;
	}